

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_zdd.c
# Opt level: O2

ZDD zdd_enum_first(ZDD dd,ZDD dom,uint8_t *arr,zdd_enum_filter_cb filter_cb)

{
  uint8_t *puVar1;
  uint8_t uVar2;
  int iVar3;
  ZDD ZVar4;
  long lVar5;
  ulong dom_00;
  long lVar6;
  
  if (dd != 0) {
    iVar3 = zdd_isleaf(dd);
    if (iVar3 == 0) {
      puVar1 = nodes->data;
      lVar5 = (dom & 0xffffffffff) * 0x10;
      lVar6 = (dd & 0xffffffffff) * 0x10;
      dom_00 = *(ulong *)(puVar1 + lVar5) & 0x800000ffffffffff;
      if ((uint)((ulong)*(undefined8 *)(puVar1 + lVar5 + 8) >> 0x28) <
          (uint)(*(ulong *)(puVar1 + lVar6 + 8) >> 0x28)) {
        ZVar4 = zdd_enum_first(dd,dom_00,arr + 1,filter_cb);
        uVar2 = '\0';
        if (ZVar4 == 0) {
          return 0;
        }
      }
      else {
        ZVar4 = zdd_enum_first(dd & 0x8000000000000000 |
                               *(ulong *)(puVar1 + lVar6 + 8) & 0xffffffffff,dom_00,arr + 1,
                               filter_cb);
        if (ZVar4 == 0) {
          ZVar4 = zdd_enum_first(*(ulong *)(puVar1 + lVar6) & 0x800000ffffffffff,dom_00,arr + 1,
                                 filter_cb);
          if (ZVar4 == 0) {
            return 0;
          }
          uVar2 = '\x01';
        }
        else {
          uVar2 = '\0';
        }
      }
      *arr = uVar2;
      return ZVar4;
    }
    if ((filter_cb == (zdd_enum_filter_cb)0x0) || (iVar3 = (*filter_cb)(dd), iVar3 != 0)) {
      for (; dom != 0x8000000000000000;
          dom = *(ulong *)(nodes->data + (dom & 0xffffffffff) * 0x10) & 0x800000ffffffffff) {
        *arr = '\0';
        arr = arr + 1;
      }
      return dd;
    }
  }
  return 0;
}

Assistant:

ZDD zdd_enum_first(ZDD dd, ZDD dom, uint8_t *arr, zdd_enum_filter_cb filter_cb)
{
    if (dd == zdd_false) {
        return zdd_false;
    } else if (zdd_isleaf(dd)) {
        if (filter_cb != NULL && filter_cb(dd) == 0) return zdd_false;
        while (dom != zdd_true) {
            *arr++ = 0;
            dom = zdd_gethigh(dom);
        }
        return dd;
    } else {
        assert(dom != zdd_true);

        /**
         * Obtain domain variable
         */
        const zddnode_t dom_node = ZDD_GETNODE(dom);
        const uint32_t dom_var = zddnode_getvariable(dom_node);
        const ZDD dom_next = zddnode_high(dom, dom_node);
        const zddnode_t dd_node = ZDD_GETNODE(dd);
        const uint32_t dd_var = zddnode_getvariable(dd_node);

        if (dom_var < dd_var) {
            // try low only (high == zdd_false)
            ZDD res = zdd_enum_first(dd, dom_next, arr+1, filter_cb);
            if (res != zdd_false) {
                *arr = 0;
                return res;
            } else {
                return zdd_false;
            }
        } else {
            /**
             * Try low first, else high, else return False
             */
            ZDD res = zdd_enum_first(zddnode_low(dd, dd_node), dom_next, arr+1, filter_cb);
            if (res != zdd_false) {
                *arr = 0;
                return res;
            }

            res = zdd_enum_first(zddnode_high(dd, dd_node), dom_next, arr+1, filter_cb);
            if (res != zdd_false) {
                *arr = 1;
                return res;
            } else {
                return zdd_false;
            }
        }
    }
}